

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_thread.cpp
# Opt level: O0

void __thiscall
incrementer<booster::shared_mutex>::operator()(incrementer<booster::shared_mutex> *this)

{
  int iVar1;
  unique_lock<booster::shared_mutex> *in_RDI;
  int tmp;
  unique_lock<booster::shared_mutex> ul;
  int i;
  mutex_type *in_stack_ffffffffffffffb8;
  longlong in_stack_ffffffffffffffd0;
  undefined4 local_c;
  
  for (local_c = 0; local_c < 5; local_c = local_c + 1) {
    std::unique_lock<booster::shared_mutex>::unique_lock(in_RDI,in_stack_ffffffffffffffb8);
    iVar1 = variable;
    booster::ptime::millisleep(in_stack_ffffffffffffffd0);
    variable = iVar1 + 1;
    std::unique_lock<booster::shared_mutex>::~unique_lock(in_RDI);
  }
  return;
}

Assistant:

void operator()()
	{
		for(int i=0;i<5;i++) {
			{
				booster::unique_lock<MutexType> ul(*mutex_);
				int tmp = variable;
				booster::ptime::millisleep(20);
				variable = tmp + 1;
			}
		}
	}